

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

pfdistances * prepare_pfdistances(player *p,loc_conflict start,_Bool only_known,_Bool forbid_traps)

{
  chunk_conflict2 *pcVar1;
  player *ppVar2;
  _Bool _Var3;
  int iVar4;
  pfdistances *ppVar5;
  int *piVar6;
  int **ppiVar7;
  queue *q;
  uintptr_t uVar8;
  size_t sVar9;
  loc grid;
  size_t sVar10;
  wchar_t wVar11;
  wchar_t wVar12;
  long lVar13;
  long lVar14;
  pfdistances *ppVar15;
  loc_conflict local_68;
  int local_5c;
  pfdistances *local_58;
  wchar_t local_4c;
  wchar_t local_48;
  wchar_t local_44;
  wchar_t local_40;
  wchar_t local_3c;
  player *local_38;
  
  if ((p->cave == (chunk_conflict2 *)0x0) ||
     (_Var3 = square_in_bounds_fully((chunk_conflict *)p->cave,(loc)start), !_Var3)) {
    ppVar5 = (pfdistances *)0x0;
  }
  else {
    ppVar5 = (pfdistances *)mem_alloc(0x20);
    piVar6 = (int *)mem_alloc((long)p->cave->width * (long)p->cave->height * 4);
    ppVar5->buffer = piVar6;
    ppiVar7 = (int **)mem_alloc((long)p->cave->height << 3);
    ppVar5->rows = ppiVar7;
    ppVar5->start = start;
    pcVar1 = p->cave;
    wVar11 = pcVar1->height;
    ppVar5->height = wVar11;
    wVar12 = pcVar1->width;
    ppVar5->width = wVar12;
    if (0 < (long)wVar11) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        ppVar5->rows[lVar14] = (int *)((long)ppVar5->buffer + lVar13);
        lVar14 = lVar14 + 1;
        lVar13 = lVar13 + (long)wVar12 * 4;
      } while (wVar11 != lVar14);
    }
    if (L'\0' < ppVar5->width) {
      piVar6 = *ppVar5->rows;
      wVar11 = L'\0';
      do {
        piVar6[wVar11] = -1;
        wVar11 = wVar11 + L'\x01';
      } while (wVar11 < ppVar5->width);
    }
    local_68.y = 1;
    local_58 = ppVar5;
    if (L'\x02' < ppVar5->height) {
      local_68.y = 1;
      ppVar15 = ppVar5;
      do {
        ppVar5 = local_58;
        *ppVar15->rows[local_68.y] = -1;
        local_68.x = 1;
        if (ppVar15->width < L'\x03') {
          iVar4 = ppVar15->width + L'\xffffffff';
        }
        else {
          do {
            _Var3 = is_valid_pf(p,local_68,only_known,forbid_traps);
            ppVar5->rows[local_68.y][local_68.x] = _Var3 - 1 | 0x7fffffff;
            local_68.x = local_68.x + 1;
            iVar4 = ppVar5->width + L'\xffffffff';
          } while (local_68.x < iVar4);
        }
        ppVar5->rows[local_68.y][iVar4] = -1;
        local_68.y = local_68.y + 1;
        ppVar15 = ppVar5;
      } while (local_68.y < ppVar5->height + L'\xffffffff');
    }
    local_68 = (loc_conflict)((ulong)(uint)local_68.y << 0x20);
    if (L'\0' < ppVar5->width) {
      ppiVar7 = ppVar5->rows;
      wVar11 = L'\0';
      do {
        ppiVar7[(long)ppVar5->height + -1][wVar11] = -1;
        wVar11 = local_68.x + L'\x01';
        local_68.x = wVar11;
      } while (wVar11 < ppVar5->width);
    }
    ppVar5->rows[(ppVar5->start).y][(ppVar5->start).x] = 0;
    local_3c = convert_turn_penalty(L'\x10',p);
    local_40 = compute_locked_penalty(p);
    local_44 = compute_rubble_penalty(p);
    local_48 = compute_passable_rubble_penalty(p);
    local_38 = p;
    local_4c = compute_tree_penalty(p);
    q = q_new((long)((ppVar5->height + ppVar5->width) * 2 + -4));
    wVar11 = grid_to_i(ppVar5->start,ppVar5->width);
    q_push(q,(long)wVar11);
    do {
      uVar8 = q_pop(q);
      i_to_grid((wchar_t)uVar8,ppVar5->width,&local_68);
      local_5c = ppVar5->rows[local_68.y][local_68.x];
      if (local_5c < 0x7fffffef) {
        local_5c = local_5c + 0x10;
        lVar13 = 0;
        do {
          grid = (loc)loc_sum(local_68,(loc_conflict)ddgrid_ddd[lVar13]);
          ppVar2 = local_38;
          lVar14 = (long)grid >> 0x20;
          wVar11 = grid.x;
          if (local_5c < ppVar5->rows[lVar14][wVar11]) {
            _Var3 = square_isknown((chunk_conflict *)local_38->cave,grid);
            if ((!_Var3) || (_Var3 = square_ispassable((chunk_conflict *)ppVar2->cave,grid), _Var3))
            {
              piVar6 = local_58->rows[lVar14];
              iVar4 = local_5c;
LAB_001ba898:
              ppVar5 = local_58;
              piVar6[wVar11] = iVar4;
              sVar9 = q_len(q);
              sVar10 = q_size(q);
              if ((sVar10 < sVar9) || (sVar9 = q_size(q), sVar9 == 0)) {
                __assert_fail("q_len(pending) <= q_size(pending) && q_size(pending) > 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                              ,0x1e9,
                              "struct pfdistances *prepare_pfdistances(struct player *, struct loc, _Bool, _Bool)"
                             );
              }
              sVar9 = q_len(q);
              sVar10 = q_size(q);
              if (sVar9 == sVar10) {
                sVar9 = q_size(q);
                if (-1 < (long)sVar9) {
                  sVar9 = q_size(q);
                  _Var3 = q_resize(q,sVar9 * 2);
                  if (!_Var3) goto LAB_001ba905;
                }
              }
              else {
LAB_001ba905:
                wVar11 = grid_to_i((loc_conflict)grid,ppVar5->width);
                q_push(q,(long)wVar11);
              }
            }
            else {
              _Var3 = square_iscloseddoor((chunk_conflict *)ppVar2->cave,grid);
              if (_Var3) {
                _Var3 = square_islockeddoor((chunk_conflict *)ppVar2->cave,grid);
                wVar12 = local_3c;
                if (_Var3) {
                  wVar12 = local_40;
                }
              }
              else {
                _Var3 = square_isrubble((chunk_conflict *)ppVar2->cave,grid);
                if (_Var3) {
                  _Var3 = square_ispassable((chunk_conflict *)ppVar2->cave,grid);
                  wVar12 = local_44;
                  if (_Var3) {
                    wVar12 = local_48;
                  }
                }
                else {
                  _Var3 = square_istree((chunk_conflict *)ppVar2->cave,grid);
                  ppVar5 = local_58;
                  wVar12 = local_4c;
                  if (!_Var3) goto LAB_001ba91c;
                }
              }
              ppVar5 = local_58;
              if (local_5c < (wVar12 ^ 0x7fffffffU)) {
                iVar4 = wVar12 + local_5c;
                piVar6 = local_58->rows[lVar14];
                if (iVar4 < piVar6[wVar11]) goto LAB_001ba898;
              }
            }
          }
LAB_001ba91c:
          lVar13 = lVar13 + 1;
        } while (lVar13 != 8);
      }
      sVar9 = q_len(q);
    } while (sVar9 != 0);
    q_free(q);
  }
  return ppVar5;
}

Assistant:

struct pfdistances *prepare_pfdistances(struct player *p, struct loc start,
		bool only_known, bool forbid_traps)
{
	struct pfdistances *result;
	struct loc grid;
	struct queue *pending;
	int unlocked_penalty, locked_penalty, rubble_penalty, prubble_penalty,
		tree_penalty;

	if (!p->cave || !square_in_bounds_fully(p->cave, start)) {
		return NULL;
	}

	result = mem_alloc(sizeof(*result));
	result->buffer = mem_alloc(p->cave->height * p->cave->width
		* sizeof(*result->buffer));
	result->rows = mem_alloc(p->cave->height * sizeof(*result->rows));
	result->start = start;
	result->height = p->cave->height;
	result->width = p->cave->width;

	/* Set up the row pointers. */
	for (grid.y = 0; grid.y < result->height; ++grid.y) {
		result->rows[grid.y] = result->buffer + grid.y * result->width;
	}

	/*
	 * Mark the outer edge as unreachable (negative distance).  Keeps
	 * things in bounds without extra checks later.  Inner grids may
	 * be unreachable; otherwise they start with the assumption of
	 * the maximum possible distance.
	 */
	grid.y = 0;
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[0][grid.x] = -1;
	}
	for (grid.y = 1; grid.y < result->height - 1; ++grid.y) {
		result->rows[grid.y][0] = -1;
		for (grid.x = 1; grid.x < result->width - 1; ++grid.x) {
			result->rows[grid.y][grid.x] = (is_valid_pf(p, grid,
				only_known, forbid_traps)) ?  INT_MAX : -1;
		}
		result->rows[grid.y][result->width - 1] = -1;
	}
	for (grid.x = 0; grid.x < result->width; ++grid.x) {
		result->rows[result->height - 1][grid.x] = -1;
	}

	/* The distance to the starting point is zero. */
	result->rows[result->start.y][result->start.x] = 0;

	/* Precompute quantities to penalize traversing some terrain;
	 * we ignore slowing in water and speedups in trees for now. */
	unlocked_penalty = compute_unlocked_penalty(p);
	locked_penalty = compute_locked_penalty(p);
	rubble_penalty = compute_rubble_penalty(p);
	prubble_penalty = compute_passable_rubble_penalty(p);
	tree_penalty = compute_tree_penalty(p);

	/*
	 * Set up a queue with the feasible points that remain to be
	 * considered.  The length of the perimeter of the cave is a guess
	 * at how many feasible points may be present at once.  Will try to
	 * resize if that turns out to be inadequate.
	 */
	pending = q_new(2 * (result->width + result->height - 2));
	/* The starting point is the point to consider. */
	q_push_int(pending, grid_to_i(result->start, result->width));

	/*
	 * For a feasible point, check the eight neighors to see if they
	 * are feasible.
	 */
	do {
		int cur_distance, i;

		i_to_grid(q_pop_int(pending), result->width, &grid);
		cur_distance = result->rows[grid.y][grid.x];
		/*
		 * Move one grid, i.e. PF_SCL, to get to the next grid.  If
		 * that exceeds the maximum distance possible, have no
		 * feasible points from the one under consideration.
		 */
		if (cur_distance >= INT_MAX - PF_SCL) {
			continue;
		}
		cur_distance += PF_SCL;

		/* Try the neighbors. */
		for (i = 0; i < 8; ++i) {
			struct loc next = loc_sum(grid, ddgrid_ddd[i]);

			/*
			 * Skip points that are unreachable or which have
			 * already been reached by a path which is at least
			 * as short as the path under consideration.
			 */
			if (result->rows[next.y][next.x] <= cur_distance) {
				continue;
			}
			/*
			 * Add next as a feasible point; penalize some terrain
			 * if it is known and hard to traverse.
			 */
			if (!square_isknown(p->cave, next)
					|| square_ispassable(p->cave, next)) {
				result->rows[next.y][next.x] = cur_distance;
			} else {
				int penalty, penalized_distance;

				if (square_iscloseddoor(p->cave, next)) {
					penalty = (square_islockeddoor(p->cave,
						next)) ? locked_penalty :
						unlocked_penalty;
				} else if (square_isrubble(p->cave, next)) {
					if (square_ispassable(p->cave, next)) {
						penalty = prubble_penalty;
					} else {
						penalty = rubble_penalty;
					}
				} else if (square_istree(p->cave, next)) {
					penalty = tree_penalty;
				} else {
					/*
					 * Should not happen, treat it as
					 * completely impassable.
					 */
					continue;
				}

				if (cur_distance >= INT_MAX - penalty) {
					/*
					 * Will exceed the maximum allowed
					 * distance so next is not feasible.
					 */
					continue;
				}
				penalized_distance = cur_distance + penalty;
				if (result->rows[next.y][next.x]
						<= penalized_distance) {
					/*
					 * Already have a path there that is
					 * shorter or the same length.  Do not
					 * need to consider this one.
					 */
					continue;
				}
				result->rows[next.y][next.x] =
					penalized_distance;
			}

			assert(q_len(pending) <= q_size(pending)
				&& q_size(pending) > 0);
			if (q_len(pending) == q_size(pending)) {
				if (q_size(pending) > SIZE_MAX / 2
						|| q_resize(pending,
						2 * q_size(pending))) {
					/*
					 * Can not hold the new pending
					 * feasible grid so skip it.
					 */
					continue;
				}
			}
			q_push_int(pending, grid_to_i(next, result->width));
		}
	} while (q_len(pending) > 0);

	q_free(pending);

	return result;
}